

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall
cmCacheManager::WritePropertyEntries
          (cmCacheManager *this,ostream *os,CacheIterator i,cmMessenger *messenger)

{
  cmMessenger *pcVar1;
  char *pcVar2;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  string key;
  allocator<char> local_99;
  undefined1 local_98 [8];
  string helpstring;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *value;
  char **p;
  cmMessenger *messenger_local;
  ostream *os_local;
  cmCacheManager *this_local;
  CacheIterator i_local;
  
  i_local.Container = (cmCacheManager *)i.Position._M_node;
  this_local = i.Container;
  p = (char **)messenger;
  messenger_local = (cmMessenger *)os;
  os_local = (ostream *)this;
  for (value = (char *)PersistentProperties; *(long *)value != 0; value = value + 8) {
    pcVar2 = *(char **)value;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar2,&local_61);
    pcVar2 = CacheIterator::GetProperty((CacheIterator *)&this_local,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    local_40 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = *(char **)value;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_98,pcVar2,&local_99);
      std::allocator<char>::~allocator(&local_99);
      std::__cxx11::string::operator+=((string *)local_98," property for variable: ");
      CacheIterator::GetName_abi_cxx11_
                ((string *)((long)&key.field_2 + 8),(CacheIterator *)&this_local);
      std::__cxx11::string::operator+=((string *)local_98,(string *)(key.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
      OutputHelpString((ostream *)messenger_local,(string *)local_98);
      CacheIterator::GetName_abi_cxx11_((string *)local_e0,(CacheIterator *)&this_local);
      std::__cxx11::string::operator+=((string *)local_e0,"-");
      std::__cxx11::string::operator+=((string *)local_e0,*(char **)value);
      OutputKey((ostream *)messenger_local,(string *)local_e0);
      std::operator<<((ostream *)messenger_local,":INTERNAL=");
      pcVar1 = messenger_local;
      pcVar2 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pcVar2,&local_101);
      OutputValue((ostream *)pcVar1,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      std::operator<<((ostream *)messenger_local,"\n");
      pcVar1 = messenger_local;
      pcVar2 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,pcVar2,&local_129);
      OutputNewlineTruncationWarning
                ((ostream *)pcVar1,(string *)local_e0,&local_128,(cmMessenger *)p);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os, CacheIterator i,
                                          cmMessenger* messenger)
{
  for (const char** p = cmCacheManager::PersistentProperties; *p; ++p) {
    if (const char* value = i.GetProperty(*p)) {
      std::string helpstring = *p;
      helpstring += " property for variable: ";
      helpstring += i.GetName();
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = i.GetName();
      key += "-";
      key += *p;
      cmCacheManager::OutputKey(os, key);
      os << ":INTERNAL=";
      cmCacheManager::OutputValue(os, value);
      os << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(os, key, value,
                                                     messenger);
    }
  }
}